

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_estimateCStreamSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  ZSTD_paramSwitch_e useRowMatchFinder;
  size_t sVar1;
  size_t sVar2;
  ulong srcSize;
  ulong uVar3;
  size_t buffInSize;
  ZSTD_compressionParameters cParams;
  
  if (0 < params->nbWorkers) {
    return 0xffffffffffffffff;
  }
  sVar1 = 0;
  ZSTD_getCParamsFromCCtxParams(&cParams,params,0xffffffffffffffff,0,ZSTD_cpm_noAttachDict);
  sVar2 = params->maxBlockSize;
  srcSize = 0x20000;
  if (sVar2 != 0) {
    srcSize = sVar2;
  }
  uVar3 = 1L << ((byte)cParams.windowLog & 0x3f);
  if (uVar3 <= srcSize) {
    srcSize = uVar3;
  }
  buffInSize = uVar3 + srcSize;
  if (params->inBufferMode != ZSTD_bm_buffered) {
    buffInSize = sVar1;
  }
  if (params->outBufferMode == ZSTD_bm_buffered) {
    sVar1 = ZSTD_compressBound(srcSize);
    sVar1 = sVar1 + 1;
  }
  useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params->useRowMatchFinder,&params->cParams);
  sVar2 = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                    (&cParams,&params->ldmParams,1,useRowMatchFinder,buffInSize,sVar1,
                     0xffffffffffffffff,
                     (uint)(params->extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0),sVar2);
  return sVar2;
}

Assistant:

size_t ZSTD_estimateCStreamSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    RETURN_ERROR_IF(params->nbWorkers > 0, GENERIC, "Estimate CCtx size is supported for single-threaded compression only.");
    {   ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(params, ZSTD_CONTENTSIZE_UNKNOWN, 0, ZSTD_cpm_noAttachDict);
        size_t const blockSize = MIN(ZSTD_resolveMaxBlockSize(params->maxBlockSize), (size_t)1 << cParams.windowLog);
        size_t const inBuffSize = (params->inBufferMode == ZSTD_bm_buffered)
                ? ((size_t)1 << cParams.windowLog) + blockSize
                : 0;
        size_t const outBuffSize = (params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        ZSTD_paramSwitch_e const useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params->useRowMatchFinder, &params->cParams);

        return ZSTD_estimateCCtxSize_usingCCtxParams_internal(
            &cParams, &params->ldmParams, 1, useRowMatchFinder, inBuffSize, outBuffSize,
            ZSTD_CONTENTSIZE_UNKNOWN, ZSTD_hasExtSeqProd(params), params->maxBlockSize);
    }
}